

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void read_bytes<double,double>
               (void *ptr,size_t n_els,char **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian)

{
  if (n_els != 0) {
    memcpy(ptr,*in,n_els * 8);
    *in = *in + n_els * 8;
  }
  if (!diff_endian) {
    return;
  }
  swap_endianness<double>((double *)ptr,n_els);
  return;
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, const char *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(ptr, n_els, in);
        if (unlikely(diff_endian)) swap_endianness((dtype*)ptr, n_els);
        return;
    }
    if (n_els == 0) return;
    if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
        buffer.resize((size_t)2 * n_els * sizeof(saved_type));
    memcpy(buffer.data(), in, n_els * sizeof(saved_type));
    in += n_els * sizeof(saved_type);

    if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
    convert_dtype<dtype, saved_type>(ptr, buffer, n_els);
}